

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# straight-recognizer.cpp
# Opt level: O2

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::StraightRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,StraightRecognizer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  less<mahjong::Pattern> *__comp;
  Pattern *pPVar3;
  allocator_type *__a;
  initializer_list<mahjong::Pattern> __l;
  allocator_type local_14;
  less<mahjong::Pattern> local_13;
  allocator_type local_12;
  less<mahjong::Pattern> local_11;
  Pattern local_10 [2];
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x1b) {
      lVar2 = -3;
      while( true ) {
        if (lVar2 == 0) {
          p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
          *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
          *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0
          ;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
          return __return_storage_ptr__;
        }
        if ((((this->has_front_tile_of_sequences)._M_elems[1]._M_elems[lVar2] == true) &&
            ((this->has_front_tile_of_sequences)._M_elems[4]._M_elems[lVar2] == true)) &&
           ((this->has_front_tile_of_sequences)._M_elems[7]._M_elems[lVar2] == true)) break;
        lVar2 = lVar2 + 1;
      }
      pPVar3 = local_10;
      local_10[0] = Straight;
      __comp = &local_13;
      __a = &local_14;
LAB_00197ec7:
      __l._M_len = 1;
      __l._M_array = pPVar3;
      std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
      set(__return_storage_ptr__,__l,__comp,__a);
      return __return_storage_ptr__;
    }
    if ((((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[lVar2] == true) &&
        ((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[lVar2 + 1] == true)) &&
       ((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[lVar2 + 2] == true)) {
      pPVar3 = local_10 + 1;
      local_10[1] = 0x17;
      __comp = &local_11;
      __a = &local_12;
      goto LAB_00197ec7;
    }
    lVar2 = lVar2 + 3;
  } while( true );
}

Assistant:

std::set<Pattern> StraightRecognizer::recognize()
{
	for (const auto& it : has_front_tile_of_sequences)
	{
		if (it[0] && it[1] && it[2])
		{
			return { Pattern::ThreeColourStraights };
		}
	}

	for (auto i = 0; i < 3; i++)
	{
		// check tiles 1, 4 and 7 each suit
		// 123 456 789 xxx
		if (has_front_tile_of_sequences[0][i] &&
			has_front_tile_of_sequences[3][i] &&
			has_front_tile_of_sequences[6][i])
		{
			return { Pattern::Straight };
		}
	}

	return {};
}